

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.hpp
# Opt level: O0

void __thiscall OpenMD::ForceField::~ForceField(ForceField *this)

{
  ForceFieldOptions *in_RDI;
  
  (in_RDI->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ForceField_005216c8;
  std::__cxx11::string::~string((string *)in_RDI[1].EnergyMixingRule.data_.field_2._M_local_buf);
  std::__cxx11::string::~string
            ((string *)
             (in_RDI[1].EnergyMixingRule.super_ParameterBase.keyword_.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&in_RDI[1].EnergyMixingRule);
  SectionParserManager::~SectionParserManager((SectionParserManager *)this);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x23b871);
  ForceFieldOptions::~ForceFieldOptions(in_RDI);
  TypeContainer<OpenMD::NonBondedInteractionType,_2>::~TypeContainer
            ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)in_RDI);
  TypeContainer<OpenMD::InversionType,_4>::~TypeContainer
            ((TypeContainer<OpenMD::InversionType,_4> *)in_RDI);
  TypeContainer<OpenMD::TorsionType,_4>::~TypeContainer
            ((TypeContainer<OpenMD::TorsionType,_4> *)in_RDI);
  TypeContainer<OpenMD::BendType,_3>::~TypeContainer((TypeContainer<OpenMD::BendType,_3> *)in_RDI);
  TypeContainer<OpenMD::BondType,_2>::~TypeContainer((TypeContainer<OpenMD::BondType,_2> *)in_RDI);
  TypeContainer<OpenMD::AtomType,_1>::~TypeContainer((TypeContainer<OpenMD::AtomType,_1> *)in_RDI);
  return;
}

Assistant:

virtual ~ForceField() = default;